

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flv.c
# Opt level: O2

int flvtag_amfcaption_708(flvtag_t *tag,uint32_t timestamp,sei_message_t *msg)

{
  byte bVar1;
  size_t sVar2;
  uint8_t *puVar3;
  uint8_t *puVar4;
  ulong uVar5;
  uint8_t *puVar6;
  uint uVar7;
  uint8_t uVar8;
  ulong uVar9;
  
  flvtag_initamf(tag,timestamp);
  sVar2 = sei_message_size(msg);
  uVar9 = (sVar2 + 2) / 3 << 2;
  flvtag_reserve(tag,(int)uVar9 + 0x2e);
  puVar3 = flvtag_payload_data(tag);
  puVar3[0] = '\x02';
  puVar3[1] = '\0';
  puVar3[2] = '\r';
  puVar3[3] = 'o';
  puVar3[4] = 'n';
  puVar3[5] = 'C';
  puVar3[6] = 'a';
  puVar3[7] = 'p';
  puVar3[8] = 't';
  puVar3[9] = 'i';
  puVar3[10] = 'o';
  puVar3[0xb] = 'n';
  puVar3[0xc] = 'I';
  puVar3[0xd] = 'n';
  puVar3[0xe] = 'f';
  puVar3[0xf] = 'o';
  puVar3[0x10] = '\b';
  puVar3[0x11] = '\0';
  puVar3[0x12] = '\0';
  puVar3[0x13] = '\0';
  puVar3[0x14] = '\x02';
  puVar3[0x15] = '\0';
  puVar3[0x16] = '\x04';
  puVar3[0x17] = 't';
  puVar3[0x18] = 'y';
  puVar3[0x19] = 'p';
  puVar3[0x1a] = 'e';
  puVar3[0x1b] = '\x02';
  puVar3[0x1c] = '\0';
  puVar3[0x1d] = '\x03';
  puVar3[0x1e] = '7';
  puVar3[0x1f] = '0';
  puVar3[0x1a] = 'e';
  puVar3[0x1b] = '\x02';
  puVar3[0x1c] = '\0';
  puVar3[0x1d] = '\x03';
  puVar3[0x1e] = '7';
  puVar3[0x1f] = '0';
  puVar3[0x20] = '8';
  puVar3[0x21] = '\0';
  puVar3[0x22] = '\x04';
  puVar3[0x23] = 'd';
  puVar3[0x24] = 'a';
  puVar3[0x25] = 't';
  puVar3[0x26] = 'a';
  puVar3[0x27] = '\x02';
  puVar3[0x28] = '\0';
  puVar3[0x29] = '\0';
  puVar3 = flvtag_payload_data(tag);
  puVar4 = sei_message_data(msg);
  sVar2 = sei_message_size(msg);
  uVar5 = (sVar2 + 2) / 3 << 2;
  if (uVar9 < uVar5) {
    uVar5 = uVar5 | 1;
  }
  else {
    puVar6 = puVar3 + 0x2a;
    for (uVar5 = 1; uVar5 - 1 < sVar2 - sVar2 % 3; uVar5 = uVar5 + 3) {
      *puVar6 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                [puVar4[uVar5 - 1] >> 2];
      puVar6[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                  [(byte)(puVar4[uVar5 - 1] << 4 | puVar4[uVar5] >> 4) & 0x3f];
      puVar6[2] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                  [(byte)(puVar4[uVar5] << 2 | puVar4[uVar5 + 1] >> 6) & 0x3f];
      puVar6[3] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                  [puVar4[uVar5 + 1] & 0x3f];
      puVar6 = puVar6 + 4;
    }
    if (uVar5 - 1 < sVar2) {
      bVar1 = puVar4[uVar5 - 1];
      uVar7 = 0;
      if (uVar5 < sVar2) {
        uVar7 = (uint)puVar4[uVar5];
      }
      *puVar6 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[bVar1 >> 2];
      puVar6[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                  [(bVar1 & 3) << 4 | uVar7 >> 4];
      uVar8 = '=';
      if (uVar5 < sVar2) {
        uVar8 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                [(ulong)(uVar7 & 0xf) * 4];
      }
      puVar6[2] = uVar8;
      puVar6[3] = '=';
      puVar6 = puVar6 + 4;
    }
    uVar5 = (long)puVar6 - (long)(puVar3 + 0x2a);
  }
  *(ushort *)(puVar3 + 0x28) = (ushort)uVar5 << 8 | (ushort)uVar5 >> 8;
  (puVar3 + uVar5 + 0x2a)[0] = '\0';
  (puVar3 + uVar5 + 0x2a)[1] = '\0';
  puVar3[uVar5 + 0x2c] = '\t';
  flvtag_updatesize(tag,(int)uVar5 + 0x2d);
  return 1;
}

Assistant:

int flvtag_amfcaption_708(flvtag_t* tag, uint32_t timestamp, sei_message_t* msg)
{
    flvtag_initamf(tag, timestamp);
    unsigned long size = 1 + (4 * ((sei_message_size(msg) + 2) / 3));
    flvtag_reserve(tag, sizeof(onCaptionInfo708) + size + 3);
    memcpy(flvtag_payload_data(tag), onCaptionInfo708, sizeof(onCaptionInfo708));
    uint8_t* data = flvtag_payload_data(tag) + sizeof(onCaptionInfo708);
    base64_encode(sei_message_data(msg), sei_message_size(msg), data, &size);

    // Update the size of the base64 string
    data[-2] = size >> 8;
    data[-1] = size >> 0;
    // write the last array element
    data[size + 0] = 0x00;
    data[size + 1] = 0x00;
    data[size + 2] = 0x09;
    flvtag_updatesize(tag, sizeof(onCaptionInfo708) + size + 3);

    return 1;
}